

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,float v)

{
  Value local_28;
  float local_14;
  SampleBuilder *pSStack_10;
  float v_local;
  SampleBuilder *this_local;
  
  local_14 = v;
  pSStack_10 = this;
  Value::Value(&local_28,(double)v);
  std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::push_back
            (&this->m_values,&local_28);
  return this;
}

Assistant:

SampleBuilder&			operator<<			(float v)	{ m_values.push_back(Value((double)v));		return *this; }